

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStringObject.cpp
# Opt level: O3

BOOL __thiscall
Js::JavascriptStringObject::GetEnumerator
          (JavascriptStringObject *this,JavascriptStaticEnumerator *enumerator,EnumeratorFlags flags
          ,ScriptContext *requestContext,EnumeratorCache *enumeratorCache)

{
  BOOL BVar1;
  Recycler *alloc;
  JavascriptStringEnumerator *this_00;
  JavascriptString *stringObject;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  local_60 = (undefined1  [8])&JavascriptStringEnumerator::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_825d793;
  data.filename._0_4_ = 0x17f;
  data._32_8_ = enumeratorCache;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                        javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                     recycler,(TrackAllocData *)local_60);
  this_00 = (JavascriptStringEnumerator *)new<Memory::Recycler>(0x20,alloc,0x387914);
  stringObject = InternalUnwrap(this);
  JavascriptStringEnumerator::JavascriptStringEnumerator(this_00,stringObject,requestContext);
  BVar1 = DynamicObject::GetEnumeratorWithPrefix
                    (&this->super_DynamicObject,(JavascriptEnumerator *)this_00,enumerator,flags,
                     requestContext,(EnumeratorCache *)data._32_8_);
  return BVar1;
}

Assistant:

BOOL JavascriptStringObject::GetEnumerator(JavascriptStaticEnumerator * enumerator, EnumeratorFlags flags, ScriptContext* requestContext, EnumeratorCache * enumeratorCache)
    {
        return GetEnumeratorWithPrefix(
            RecyclerNew(GetScriptContext()->GetRecycler(), JavascriptStringEnumerator, this->Unwrap(), requestContext),
            enumerator, flags, requestContext, enumeratorCache);
    }